

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::tryUnitPartitioning(string *unit_string,uint64_t match_flags)

{
  double dVar1;
  size_t sVar2;
  char closeSegment;
  bool bVar3;
  char *pcVar4;
  uint64_t uVar5;
  long lVar6;
  iterator __first;
  iterator __last;
  ulong uVar7;
  int iVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  pair<double,_unsigned_long> pVar10;
  precise_unit pVar11;
  ulong local_560;
  bool local_4b1;
  bool local_4a1;
  string local_3c0;
  undefined1 local_3a0 [8];
  precise_unit bunit_2;
  uint64_t nmatch_flags;
  undefined1 local_368 [8];
  precise_unit res_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *vd;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  value_type local_320;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  const_iterator local_2f8;
  string local_2f0;
  undefined1 local_2d0 [8];
  precise_unit bunit_1;
  value_type local_288;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  const_iterator local_260;
  string local_258;
  undefined1 auStack_238 [8];
  precise_unit qm2;
  undefined1 local_208 [8];
  precise_unit res_1;
  size_t start;
  precise_unit temp;
  string local_1b0;
  undefined1 local_190 [8];
  precise_unit bunit;
  string local_150;
  undefined1 local_130 [8];
  precise_unit res;
  undefined1 auStack_118 [7];
  bool hasSep;
  precise_unit possible;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid;
  uint64_t minPartitionSize;
  size_t local_c8;
  size_t part;
  string local_b8;
  undefined1 local_98 [8];
  precise_unit retunit;
  pair<double,_unsigned_long> mret;
  string ustring;
  uint64_t match_flags_local;
  string *unit_string_local;
  double local_10;
  precise_unit *ppVar9;
  
  std::__cxx11::string::string((string *)&mret.second,(string *)unit_string);
  pVar10 = getPrefixMultiplierWord(unit_string);
  mret.first = (double)pVar10.second;
  dVar1 = pVar10.first;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    std::__cxx11::string::substr((ulong)&retunit.base_units_,(ulong)unit_string);
    std::__cxx11::string::operator=((string *)&mret.second,(string *)&retunit.base_units_);
    std::__cxx11::string::~string((string *)&retunit.base_units_);
    std::__cxx11::string::string((string *)&local_b8,(string *)&mret.second);
    pVar11 = unit_from_string_internal(&local_b8,match_flags);
    retunit.multiplier_ = pVar11._8_8_;
    local_98 = (undefined1  [8])pVar11.multiplier_;
    std::__cxx11::string::~string((string *)&local_b8);
    bVar3 = is_valid((precise_unit *)local_98);
    if (bVar3) {
      precise_unit::precise_unit((precise_unit *)&unit_string_local,dVar1,(precise_unit *)local_98);
      part._4_4_ = 1;
    }
    else {
      unit_string_local = (string *)0x7ff4000000000000;
      local_10 = 2.07707442941207e-314;
      part._4_4_ = 1;
    }
    goto LAB_0019d57d;
  }
  pcVar4 = (char *)std::__cxx11::string::front();
  local_c8 = (ulong)(*pcVar4 != 'N') * 2 + 1;
  std::__cxx11::string::substr((ulong)&minPartitionSize,(ulong)unit_string);
  std::__cxx11::string::operator=((string *)&mret.second,(string *)&minPartitionSize);
  std::__cxx11::string::~string((string *)&minPartitionSize);
  pcVar4 = (char *)std::__cxx11::string::back();
  if (((*pcVar4 == '(') || (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '[')) ||
     (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '{')) {
    local_c8 = 1;
    std::__cxx11::string::pop_back();
  }
  uVar5 = getMinPartitionSize(match_flags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&possible.base_units_);
  _auStack_118 = (string *)0x7ff4000000000000;
  possible.multiplier_ = 2.07707442941207e-314;
  res.commodity_._3_1_ = 0;
LAB_0019c6cd:
  sVar2 = local_c8;
  lVar6 = std::__cxx11::string::size();
  if ((sVar2 < lVar6 - 1U) && (lVar6 = std::__cxx11::string::size(), uVar5 <= lVar6 - local_c8)) {
    uVar7 = std::__cxx11::string::size();
    if (uVar5 <= uVar7) {
      std::__cxx11::string::string((string *)&local_150,(string *)&mret.second);
      pVar11 = unit_quick_match(&local_150,match_flags);
      res.multiplier_ = pVar11._8_8_;
      local_130 = (undefined1  [8])pVar11.multiplier_;
      std::__cxx11::string::~string((string *)&local_150);
      bVar3 = is_valid((precise_unit *)local_130);
      if (((!bVar3) && (uVar7 = std::__cxx11::string::size(), 2 < uVar7)) &&
         ((pcVar4 = (char *)std::__cxx11::string::front(), '@' < *pcVar4 &&
          (pcVar4 = (char *)std::__cxx11::string::front(), *pcVar4 < '[')))) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&mret.second);
        *pcVar4 = *pcVar4 + ' ';
        std::__cxx11::string::string((string *)&bunit.base_units_,(string *)&mret.second);
        pVar11 = unit_quick_match((string *)&bunit.base_units_,match_flags);
        res.multiplier_ = pVar11._8_8_;
        local_130 = (undefined1  [8])pVar11.multiplier_;
        std::__cxx11::string::~string((string *)&bunit.base_units_);
      }
      bVar3 = is_valid((precise_unit *)local_130);
      if (bVar3) {
        std::__cxx11::string::substr((ulong)&local_1b0,(ulong)unit_string);
        pVar11 = unit_from_string_internal(&local_1b0,match_flags | 0x400000000);
        bunit.multiplier_ = pVar11._8_8_;
        local_190 = (undefined1  [8])pVar11.multiplier_;
        std::__cxx11::string::~string((string *)&local_1b0);
        bVar3 = is_valid((precise_unit *)local_190);
        if (bVar3) {
          bVar3 = is_valid((precise_unit *)auStack_118);
          if (bVar3) {
            pVar11 = precise_unit::operator*((precise_unit *)local_130,(precise_unit *)local_190);
            temp.multiplier_ = pVar11._8_8_;
            start = (size_t)pVar11.multiplier_;
            ppVar9 = (precise_unit *)&start;
            dVar1 = precise_unit::multiplier(ppVar9);
            iVar8 = (int)ppVar9;
            log10(dVar1);
            std::abs(iVar8);
            ppVar9 = (precise_unit *)auStack_118;
            dVar1 = precise_unit::multiplier(ppVar9);
            iVar8 = (int)ppVar9;
            log10(dVar1);
            std::abs(iVar8);
            if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <
                (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) {
              _auStack_118 = (string *)start;
              possible.multiplier_ = temp.multiplier_;
            }
          }
          else {
            pVar11 = precise_unit::operator*((precise_unit *)local_130,(precise_unit *)local_190);
            possible.multiplier_ = pVar11._8_8_;
            temp._8_8_ = pVar11.multiplier_;
            _auStack_118 = (string *)temp._8_8_;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&possible.base_units_,(value_type *)&mret.second);
      }
    }
    std::__cxx11::string::operator[]((ulong)unit_string);
    std::__cxx11::string::push_back((char)&mret + '\b');
    local_c8 = local_c8 + 1;
    pcVar4 = (char *)std::__cxx11::string::back();
    if (((*pcVar4 == '(') || (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '[')) ||
       (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '{')) {
      pcVar4 = (char *)std::__cxx11::string::back();
      closeSegment = getMatchCharacter(*pcVar4);
      segmentcheck(unit_string,closeSegment,&local_c8);
      pcVar4 = (char *)std::__cxx11::string::back();
      if ((*pcVar4 == '(') &&
         (uVar7 = std::__cxx11::string::find_first_of((char *)unit_string,0x1cd46a),
         uVar7 < local_c8)) goto LAB_0019cda8;
      std::__cxx11::string::substr((ulong)&res_1.base_units_,(ulong)unit_string);
      std::__cxx11::string::operator=((string *)&mret.second,(string *)&res_1.base_units_);
      std::__cxx11::string::~string((string *)&res_1.base_units_);
    }
    do {
      pcVar4 = (char *)std::__cxx11::string::back();
      if (*pcVar4 == '_') {
LAB_0019cc4f:
        sVar2 = local_c8;
        lVar6 = std::__cxx11::string::size();
        bVar3 = sVar2 < lVar6 - 1U;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::back();
        bVar3 = false;
        if (*pcVar4 == '-') goto LAB_0019cc4f;
      }
      if (!bVar3) goto LAB_0019ccc8;
      res.commodity_._3_1_ = 1;
      std::__cxx11::string::operator[]((ulong)unit_string);
      std::__cxx11::string::push_back((char)&mret + '\b');
      local_c8 = local_c8 + 1;
    } while( true );
  }
LAB_0019cda8:
  bVar3 = is_valid((precise_unit *)auStack_118);
  if (bVar3) {
    unit_string_local = _auStack_118;
    local_10 = possible.multiplier_;
  }
  else {
    if ((uVar5 < 2) && (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == 'm')) {
      std::__cxx11::string::string((string *)&qm2.base_units_,(string *)&mret.second);
      pVar11 = unit_quick_match((string *)&qm2.base_units_,match_flags);
      res_1.multiplier_ = pVar11._8_8_;
      local_208 = (undefined1  [8])pVar11.multiplier_;
      std::__cxx11::string::~string((string *)&qm2.base_units_);
      bVar3 = is_valid((precise_unit *)local_208);
      if (bVar3) {
        pVar11 = precise_unit::operator*((precise_unit *)local_208,(unit *)&m);
        local_10 = pVar11._8_8_;
        unit_string_local = (string *)pVar11.multiplier_;
        goto LAB_0019d561;
      }
    }
    if ((uVar5 < 3) && ((res.commodity_._3_1_ & 1) == 0)) {
      std::__cxx11::string::substr((ulong)&local_258,(ulong)unit_string);
      pVar11 = unit_quick_match(&local_258,match_flags);
      qm2.multiplier_ = pVar11._8_8_;
      auStack_238 = (undefined1  [8])pVar11.multiplier_;
      std::__cxx11::string::~string((string *)&local_258);
      bVar3 = is_valid((precise_unit *)auStack_238);
      if (bVar3) {
        local_268._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&possible.base_units_);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_260,&local_268);
        std::__cxx11::string::substr((ulong)&local_288,(ulong)unit_string);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&possible.base_units_,local_260,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
      }
      else {
        lVar6 = std::__cxx11::string::size();
        if (lVar6 == 4) {
          std::__cxx11::string::substr((ulong)&bunit_1.base_units_,(ulong)unit_string);
          pVar11 = unit_quick_match((string *)&bunit_1.base_units_,match_flags);
          qm2.multiplier_ = pVar11._8_8_;
          auStack_238 = (undefined1  [8])pVar11.multiplier_;
          std::__cxx11::string::~string((string *)&bunit_1.base_units_);
          std::__cxx11::string::substr((ulong)&local_2f0,(ulong)unit_string);
          pVar11 = unit_from_string_internal(&local_2f0,match_flags);
          bunit_1.multiplier_ = pVar11._8_8_;
          local_2d0 = (undefined1  [8])pVar11.multiplier_;
          std::__cxx11::string::~string((string *)&local_2f0);
          bVar3 = is_valid((precise_unit *)local_2d0);
          if (bVar3) {
            pVar11 = precise_unit::operator*((precise_unit *)auStack_238,(precise_unit *)local_2d0);
            local_10 = pVar11._8_8_;
            unit_string_local = (string *)pVar11.multiplier_;
            goto LAB_0019d561;
          }
        }
      }
    }
    if ((uVar5 < 2) &&
       ((pcVar4 = (char *)std::__cxx11::string::front(), *pcVar4 == 'V' ||
        (pcVar4 = (char *)std::__cxx11::string::front(), *pcVar4 == 'A')))) {
      local_300._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&possible.base_units_);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_2f8,&local_300);
      std::__cxx11::string::substr((ulong)&local_320,(ulong)unit_string);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&possible.base_units_,local_2f8,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
    }
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&possible.base_units_);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&possible.base_units_);
    std::
    reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&possible.base_units_);
    vd = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&possible.base_units_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&vd), bVar3) {
      res_2._8_8_ = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
      std::__cxx11::string::string((string *)&nmatch_flags,(string *)res_2._8_8_);
      pVar11 = unit_quick_match((string *)&nmatch_flags,match_flags);
      res_2.multiplier_ = pVar11._8_8_;
      local_368 = (undefined1  [8])pVar11.multiplier_;
      std::__cxx11::string::~string((string *)&nmatch_flags);
      uVar7 = std::__cxx11::string::size();
      local_560 = match_flags;
      if (uVar7 < 4) {
        local_560 = match_flags | 0x6000000000;
      }
      bunit_2.base_units_ = (unit_data)(undefined4)local_560;
      bunit_2.commodity_ = local_560._4_4_;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_3c0,(ulong)unit_string);
      pVar11 = unit_from_string_internal(&local_3c0,bunit_2._8_8_);
      bunit_2.multiplier_ = pVar11._8_8_;
      local_3a0 = (undefined1  [8])pVar11.multiplier_;
      std::__cxx11::string::~string((string *)&local_3c0);
      bVar3 = is_valid((precise_unit *)local_3a0);
      if (bVar3) {
        pVar11 = precise_unit::operator*((precise_unit *)local_368,(precise_unit *)local_3a0);
        local_10 = pVar11._8_8_;
        unit_string_local = (string *)pVar11.multiplier_;
        goto LAB_0019d561;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    unit_string_local = (string *)0x7ff4000000000000;
    local_10 = 2.07707442941207e-314;
  }
LAB_0019d561:
  part._4_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&possible.base_units_);
LAB_0019d57d:
  std::__cxx11::string::~string((string *)&mret.second);
  pVar11._8_8_ = local_10;
  pVar11.multiplier_ = (double)unit_string_local;
  return pVar11;
LAB_0019ccc8:
  pcVar4 = (char *)std::__cxx11::string::back();
  bVar3 = isDigitCharacter(*pcVar4);
  if (bVar3) {
    while( true ) {
      sVar2 = local_c8;
      lVar6 = std::__cxx11::string::size();
      local_4a1 = false;
      if (sVar2 < lVar6 - 1U) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        local_4b1 = true;
        if (*pcVar4 != '.') {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          local_4b1 = isDigitCharacter(*pcVar4);
        }
        local_4a1 = local_4b1;
      }
      if (local_4a1 == false) break;
      std::__cxx11::string::operator[]((ulong)unit_string);
      std::__cxx11::string::push_back((char)&mret + '\b');
      local_c8 = local_c8 + 1;
    }
  }
  goto LAB_0019c6cd;
}

Assistant:

static precise_unit tryUnitPartitioning(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    std::string ustring = unit_string;

    auto mret = getPrefixMultiplierWord(unit_string);
    if (mret.first != 0.0) {
        ustring = unit_string.substr(mret.second);

        auto retunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(retunit)) {
            return {mret.first, retunit};
        }
        return precise::invalid;
    }

    // a newton(N) in front is somewhat common
    // try a round with just a quick partition
    size_t part = (unit_string.front() == 'N') ? 1 : 3;
    ustring = unit_string.substr(0, part);
    if (ustring.back() == '(' || ustring.back() == '[' ||
        ustring.back() == '{') {
        part = 1;
        ustring.pop_back();
    }
    auto minPartitionSize = getMinPartitionSize(match_flags);
    std::vector<std::string> valid;
    precise_unit possible = precise::invalid;
    bool hasSep{false};
    while (part < unit_string.size() - 1) {
        if (unit_string.size() - part < minPartitionSize) {
            break;
        }
        if (ustring.size() >= minPartitionSize) {
            auto res = unit_quick_match(ustring, match_flags);
            if (!is_valid(res) && ustring.size() >= 3) {
                if (ustring.front() >= 'A' &&
                    ustring.front() <= 'Z') {  // check the lower case version
                                               // since we skipped partitioning
                                               // when we did this earlier
                    ustring[0] += 32;
                    res = unit_quick_match(ustring, match_flags);
                }
            }
            if (is_valid(res)) {
                auto bunit = unit_from_string_internal(
                    unit_string.substr(part),
                    match_flags | skip_partition_check);
                if (is_valid(bunit)) {
                    if (!is_valid(possible)) {
                        possible = res * bunit;
                    } else {
                        auto temp = res * bunit;
                        if (std::abs(log10(temp.multiplier())) <
                            std::abs(log10(possible.multiplier()))) {
                            possible = temp;
                        }
                    }
                }
                valid.push_back(ustring);
            }
        }
        ustring.push_back(unit_string[part]);
        ++part;
        if (ustring.back() == '(' || ustring.back() == '[' ||
            ustring.back() == '{') {
            auto start = part;
            segmentcheck(unit_string, getMatchCharacter(ustring.back()), part);
            if (ustring.back() == '(') {
                if (unit_string.find_first_of("({[*/", start) < part) {
                    // this implies that the contents of the parenthesis
                    // must be a standalone segment and should not be
                    // included in a check
                    break;
                }
            }
            ustring = unit_string.substr(0, part);
        }
        while ((ustring.back() == '_' || ustring.back() == '-') &&
               (part < unit_string.size() - 1)) {
            hasSep = true;
            ustring.push_back(unit_string[part]);
            ++part;
        }
        if (isDigitCharacter(ustring.back())) {
            while ((part < unit_string.size() - 1) &&
                   (unit_string[part] == '.' ||
                    isDigitCharacter(unit_string[part]))) {
                ustring.push_back(unit_string[part]);
                ++part;
            }
        }
    }
    if (is_valid(possible)) {
        return possible;
    }
    if (minPartitionSize <= 1) {
        // meter is somewhat common ending so just check that one too
        if (unit_string.back() == 'm') {
            auto res = unit_quick_match(ustring, match_flags);
            if (is_valid(res)) {
                return res * m;
            }
        }
    }
    if (minPartitionSize <= 2 && !hasSep) {
        // now do a quick check with a 2 character string since we skipped that
        // earlier
        auto qm2 = unit_quick_match(unit_string.substr(0, 2), match_flags);
        if (is_valid(qm2)) {
            valid.insert(valid.begin(), unit_string.substr(0, 2));
        } else if (unit_string.size() == 4) {  // length of 4 is a bit odd so
                                               // check the back two characters
                                               // for a quick match
            qm2 = unit_quick_match(unit_string.substr(2, 2), match_flags);
            auto bunit = unit_from_string_internal(
                unit_string.substr(0, 2), match_flags);
            if (is_valid(bunit)) {
                return qm2 * bunit;
            }
        }
    }
    if (minPartitionSize <= 1) {
        // now pick off a couple 1 character units
        if (unit_string.front() == 'V' || unit_string.front() == 'A') {
            valid.insert(valid.begin(), unit_string.substr(0, 1));
        }
    }
    // start with the biggest
    std::reverse(valid.begin(), valid.end());
    for (auto& vd : valid) {
        auto res = unit_quick_match(vd, match_flags);
        auto nmatch_flags = (vd.size() > 3) ?
            match_flags :
            match_flags | minimum_partition_size3;
        auto bunit = unit_from_string_internal(
            unit_string.substr(vd.size()), nmatch_flags);
        if (is_valid(bunit)) {
            return res * bunit;
        }
    }

    return precise::invalid;
}